

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_inven(wchar_t mode,item_tester tester)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  bool bVar5;
  wchar_t wStack_20;
  _Bool in_term;
  wchar_t diff;
  wchar_t last_slot;
  wchar_t i;
  item_tester tester_local;
  wchar_t mode_local;
  
  wStack_20 = L'\xffffffff';
  wVar3 = weight_remaining(player);
  bVar5 = (mode & 1U) != 0;
  wipe_obj_list();
  if (bVar5) {
    wVar1 = wVar3;
    if (wVar3 < L'\x01') {
      wVar1 = -wVar3;
    }
    wVar2 = wVar3;
    if (wVar3 < L'\x01') {
      wVar2 = -wVar3;
    }
    pcVar4 = "remaining";
    if (wVar3 < L'\0') {
      pcVar4 = "overweight";
    }
    strnfmt(items[num_obj].label,0x50,"Burden %d.%d lb (%d.%d lb %s) ",
            (long)player->upkeep->total_weight / 10 & 0xffffffff,
            (long)player->upkeep->total_weight % 10 & 0xffffffff,(long)wVar1 / 10 & 0xffffffff,
            wVar2 % 10,pcVar4);
    items[num_obj].object = (object *)0x0;
    num_obj = num_obj + L'\x01';
  }
  for (diff = L'\0'; diff < (int)(uint)z_info->pack_size; diff = diff + L'\x01') {
    if (player->upkeep->inven[diff] != (object *)0x0) {
      wStack_20 = diff;
    }
  }
  build_obj_list(wStack_20,player->upkeep->inven,tester,mode);
  num_head = (wchar_t)bVar5;
  show_obj_list(mode);
  return;
}

Assistant:

void show_inven(int mode, item_tester tester)
{
	int i, last_slot = -1;
	int diff = weight_remaining(player);

	bool in_term = (mode & OLIST_WINDOW) ? true : false;

	/* Initialize */
	wipe_obj_list();

	/* Include burden for term windows */
	if (in_term) {
		strnfmt(items[num_obj].label, sizeof(items[num_obj].label),
		        "Burden %d.%d lb (%d.%d lb %s) ",
		        player->upkeep->total_weight / 10,
				player->upkeep->total_weight % 10,
		        abs(diff) / 10, abs(diff) % 10,
		        (diff < 0 ? "overweight" : "remaining"));

		items[num_obj].object = NULL;
		num_obj++;
	}

	/* Find the last occupied inventory slot */
	for (i = 0; i < z_info->pack_size; i++)
		if (player->upkeep->inven[i] != NULL) last_slot = i;

	/* Build the object list */
	build_obj_list(last_slot, player->upkeep->inven, tester, mode);

	/* Term window starts with a burden header */
	num_head = in_term ? 1 : 0;

	/* Display the object list */
	show_obj_list(mode);
}